

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall
gmath::PinholeCamera::reconstructRay(PinholeCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  Vector3d *a;
  SVector<double,_3> *in_RDX;
  SVector<double,_3> *in_RSI;
  Camera *in_RDI;
  Vector3d Pc;
  Vector2d *in_stack_00000060;
  Vector3d *in_stack_00000068;
  PinholeCamera *in_stack_00000070;
  SVector<double,_3> local_50;
  SVector<double,_3> *in_stack_ffffffffffffffd0;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffffd8;
  
  SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xffffffffffffffc8);
  reconstructLocal(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  Camera::getR(in_RDI);
  SMatrix<double,_3,_3>::operator*(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SVector<double,_3>::operator=(in_RSI,&local_50);
  a = Camera::getT(in_RDI);
  SVector<double,_3>::operator=(in_RDX,a);
  return;
}

Assistant:

void PinholeCamera::reconstructRay(Vector3d &V, Vector3d &C, const Vector2d &p) const
{
  Vector3d Pc;
  reconstructLocal(Pc, p);

  V=getR()*Pc;
  C=getT();
}